

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

const_iterator __thiscall PcodeOpBank::end(PcodeOpBank *this,Address *addr)

{
  const_iterator cVar1;
  SeqNum local_38;
  Address *local_20;
  Address *addr_local;
  PcodeOpBank *this_local;
  
  local_20 = addr;
  addr_local = (Address *)this;
  SeqNum::SeqNum(&local_38,addr,0xffffffff);
  cVar1 = std::
          map<SeqNum,_PcodeOp_*,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
          ::upper_bound(&this->optree,&local_38);
  return (const_iterator)cVar1._M_node;
}

Assistant:

PcodeOpTree::const_iterator PcodeOpBank::end(const Address &addr) const

{
  return optree.upper_bound(SeqNum(addr,~((uintm)0)));
}